

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int patchtestreg(FuncState *fs,int node,int reg)

{
  Instruction *pIVar1;
  Instruction *i;
  int reg_local;
  int node_local;
  FuncState *fs_local;
  
  pIVar1 = getjumpcontrol(fs,node);
  if ((*pIVar1 & 0x3f) == 0x1c) {
    if ((reg == 0xff) || (reg == *pIVar1 >> 0x17)) {
      *pIVar1 = (*pIVar1 >> 0x17) << 6 | 0x1b | (*pIVar1 >> 0xe & 0x1ff) << 0xe;
    }
    else {
      *pIVar1 = *pIVar1 & 0xffffc03f | (reg & 0xffU) << 6;
    }
    fs_local._4_4_ = 1;
  }
  else {
    fs_local._4_4_ = 0;
  }
  return fs_local._4_4_;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i))
    SETARG_A(*i, reg);
  else  /* no register to put value or register already has the value */
    *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));

  return 1;
}